

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::Cord::AppendImpl<absl::Cord>(Cord *this,Cord *src)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  CordzInfo *pCVar4;
  long sampling_stride;
  ulong uVar5;
  size_t sVar6;
  uint8_t *puVar7;
  CordRep *pCVar8;
  long *in_FS_OFFSET;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dd;
  string_view src_00;
  ChunkIterator __begin0;
  undefined1 local_b8 [12];
  undefined4 uStack_ac;
  CordRep *local_a8;
  size_t sStack_a0;
  CordRepBtreeReader local_98;
  
  pCVar8 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar8 != (CordRep *)0x0 && ((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) &&
     (pCVar8->length == 0)) goto LAB_00172bf8;
  do {
    bVar1 = (byte)((CordRepBtreeReader *)src)->remaining_;
    uVar3 = (ulong)(char)bVar1;
    if ((uVar3 & 1) == 0) {
      uVar5 = uVar3 >> 1;
    }
    else {
      uVar5 = **(ulong **)&((CordRepBtreeReader *)src)->navigator_;
    }
    if (uVar5 == 0) {
      return;
    }
    uVar5 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
    if ((uVar5 & 1) == 0) {
      uVar5 = uVar5 >> 1;
    }
    else {
      uVar5 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    if (uVar5 == 0) {
      if ((bVar1 & 1) == 0) {
        pCVar8 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info =
             ((CordRepBtreeReader *)src)->remaining_;
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar8;
      }
      else {
        pCVar8 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
        pCVar4 = cord_internal::InlineData::cordz_info((InlineData *)src);
        if (pCVar4 != (CordzInfo *)0x0) {
          cord_internal::CordzInfo::Untrack(pCVar4);
        }
        ((CordRepBtreeReader *)src)->remaining_ = 0;
        (((CordRepBtreeReader *)src)->navigator_).height_ = 0;
        (((CordRepBtreeReader *)src)->navigator_).index_[0] = '\0';
        (((CordRepBtreeReader *)src)->navigator_).index_[1] = '\0';
        (((CordRepBtreeReader *)src)->navigator_).index_[2] = '\0';
        (((CordRepBtreeReader *)src)->navigator_).index_[3] = '\0';
        if (pCVar8 == (CordRep *)0x0) goto LAB_00172cce;
        if (pCVar8->tag == '\x02') {
          AppendImpl<absl::Cord>();
          pCVar8 = (CordRep *)local_b8._0_8_;
        }
        if (pCVar8 == (CordRep *)0x0) {
          __assert_fail("rep",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/cord.h"
                        ,0x4ed,
                        "void absl::Cord::InlineRep::EmplaceTree(CordRep * _Nonnull, MethodIdentifier)"
                       );
        }
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar8;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
        if (in_FS_OFFSET[-6] < 2) {
          sampling_stride =
               cord_internal::cordz_should_profile_slow((SamplingState *)(*in_FS_OFFSET + -0x30));
        }
        else {
          in_FS_OFFSET[-6] = in_FS_OFFSET[-6] + -1;
          sampling_stride = 0;
        }
        if (0 < sampling_stride) {
          cord_internal::CordzInfo::TrackCord((InlineData *)this,kAppendCord,sampling_stride);
          return;
        }
      }
      return;
    }
    if ((uVar3 & 1) == 0) {
      uVar5 = uVar3 >> 1;
    }
    else {
      uVar5 = **(ulong **)&((CordRepBtreeReader *)src)->navigator_;
    }
    pCVar8 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
    if (0x1ff < uVar5) {
      if ((bVar1 & 1) == 0) {
        pCVar8 = (CordRep *)0x0;
      }
      else {
        pCVar4 = cord_internal::InlineData::cordz_info((InlineData *)src);
        if (pCVar4 != (CordzInfo *)0x0) {
          cord_internal::CordzInfo::Untrack(pCVar4);
        }
      }
      ((CordRepBtreeReader *)src)->remaining_ = 0;
      (((CordRepBtreeReader *)src)->navigator_).height_ = 0;
      (((CordRepBtreeReader *)src)->navigator_).index_[0] = '\0';
      (((CordRepBtreeReader *)src)->navigator_).index_[1] = '\0';
      (((CordRepBtreeReader *)src)->navigator_).index_[2] = '\0';
      (((CordRepBtreeReader *)src)->navigator_).index_[3] = '\0';
      if (pCVar8 != (CordRep *)0x0) {
        if (pCVar8->tag == '\x02') {
          AppendImpl<absl::Cord>();
          pCVar8 = (CordRep *)local_b8._0_8_;
        }
        InlineRep::AppendTree(&this->contents_,pCVar8,kAppendCord);
        return;
      }
LAB_00172cce:
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_crc.h"
                    ,0x37,"CordRep *absl::cord_internal::RemoveCrcNode(CordRep *)");
    }
    if (pCVar8 == (CordRep *)0x0 || (bVar1 & 1) == 0) {
      puVar7 = (uint8_t *)0x0;
      if ((bVar1 & 1) == 0) {
        puVar7 = (uint8_t *)((long)&((CordRepBtreeReader *)src)->remaining_ + 1);
      }
LAB_00172a7d:
      src_00._M_str = (char *)puVar7;
      src_00._M_len = uVar5;
      InlineRep::AppendArray(&this->contents_,src_00,kAppendCord);
      return;
    }
    bVar2 = pCVar8->tag;
    if (5 < bVar2) {
      if ((bVar2 - 0xf9 < 7) || (bVar2 < 6)) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
      }
      puVar7 = pCVar8->storage;
      goto LAB_00172a7d;
    }
    if (src == this) {
      Cord((Cord *)local_b8,src);
      AppendImpl<absl::Cord>(this,(Cord *)local_b8);
      ~Cord((Cord *)local_b8);
      return;
    }
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    local_a8 = (CordRep *)0x0;
    sStack_a0 = 0;
    _local_b8 = (string_view)ZEXT816(0);
    local_98.remaining_ = 0;
    local_98.navigator_.height_ = -1;
    if (pCVar8 == (CordRep *)0x0 || (bVar1 & 1) == 0) {
      if ((bVar1 & 1) == 0) {
        sStack_a0 = uVar3 >> 1;
        stack0xffffffffffffff50 = (char *)((long)&((CordRepBtreeReader *)src)->remaining_ + 1);
        local_b8._0_8_ = sStack_a0;
      }
      else {
        AppendImpl<absl::Cord>();
        uVar9 = extraout_XMM0_Da;
        uVar10 = extraout_XMM0_Db;
        uVar11 = extraout_XMM0_Dc;
        uVar12 = extraout_XMM0_Dd;
LAB_00172c87:
        local_b8._4_4_ = uVar10;
        local_b8._0_4_ = uVar9;
        local_b8._8_4_ = uVar11;
        uStack_ac = uVar12;
      }
    }
    else {
      sStack_a0 = pCVar8->length;
      if (sStack_a0 == 0) goto LAB_00172c87;
      ChunkIterator::InitTree((ChunkIterator *)local_b8,pCVar8);
    }
    if (sStack_a0 == 0) {
      return;
    }
    src = (Cord *)&local_98;
    while (InlineRep::AppendArray(&this->contents_,_local_b8,kAppendString), sStack_a0 != 0) {
      sVar6 = sStack_a0 - local_b8._0_8_;
      if (sStack_a0 < (ulong)local_b8._0_8_) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/cord.h"
                      ,0x616,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      sStack_a0 = sVar6;
      if (sVar6 != 0) {
        if (((long)local_98.navigator_.height_ < 0) ||
           (local_98.navigator_.node_[local_98.navigator_.height_] == (CordRepBtree *)0x0)) {
          if (local_b8._0_8_ == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/cord.h"
                          ,0x61c,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          _local_b8 = (string_view)ZEXT816(0);
        }
        else {
          _local_b8 = cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)src);
        }
      }
      if (sStack_a0 == 0) {
        return;
      }
    }
    AppendImpl<absl::Cord>();
LAB_00172bf8:
    AppendImpl<absl::Cord>();
  } while( true );
}

Assistant:

inline void Cord::AppendImpl(C&& src) {
  auto constexpr method = CordzUpdateTracker::kAppendCord;

  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  if (empty()) {
    // Since destination is empty, we can avoid allocating a node,
    if (src.contents_.is_tree()) {
      // by taking the tree directly
      CordRep* rep =
          cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
      contents_.EmplaceTree(rep, method);
    } else {
      // or copying over inline data
      contents_.data_ = src.contents_.data_;
    }
    return;
  }

  // For short cords, it is faster to copy data if there is room in dst.
  const size_t src_size = src.contents_.size();
  if (src_size <= kMaxBytesToCopy) {
    CordRep* src_tree = src.contents_.tree();
    if (src_tree == nullptr) {
      // src has embedded data.
      contents_.AppendArray({src.contents_.data(), src_size}, method);
      return;
    }
    if (src_tree->IsFlat()) {
      // src tree just has one flat node.
      contents_.AppendArray({src_tree->flat()->Data(), src_size}, method);
      return;
    }
    if (&src == this) {
      // ChunkIterator below assumes that src is not modified during traversal.
      Append(Cord(src));
      return;
    }
    // TODO(mec): Should we only do this if "dst" has space?
    for (absl::string_view chunk : src.Chunks()) {
      Append(chunk);
    }
    return;
  }

  // Guaranteed to be a tree (kMaxBytesToCopy > kInlinedSize)
  CordRep* rep = cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
  contents_.AppendTree(rep, CordzUpdateTracker::kAppendCord);
}